

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test1.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  long *plVar4;
  long lVar5;
  int x;
  thread_pool pool;
  result res2;
  result res [10];
  int local_5bc;
  code *local_5b8;
  undefined8 local_5b0;
  code *local_5a8;
  code *local_5a0;
  undefined8 *local_598;
  undefined8 uStack_590;
  code *local_588;
  code *pcStack_580;
  undefined8 *local_578;
  undefined8 uStack_570;
  code *local_568;
  code *pcStack_560;
  timespec local_550;
  code *local_540;
  undefined8 local_538;
  code *local_530;
  code *local_528;
  thread_pool local_520 [200];
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  condition_variable local_430 [48];
  undefined2 local_400;
  undefined8 local_3f8 [5];
  condition_variable acStack_3d0 [48];
  undefined2 local_3a0 [440];
  
  nonstd::thread_pool::thread_pool(local_520,0xe);
  nonstd::thread_pool::start();
  lVar5 = 0;
  do {
    *(undefined8 *)((long)local_3f8 + lVar5 + 0x10) = 0;
    *(undefined8 *)((long)local_3f8 + lVar5 + 0x18) = 0;
    *(undefined8 *)((long)local_3f8 + lVar5) = 0;
    *(undefined8 *)((long)local_3f8 + lVar5 + 8) = 0;
    *(undefined8 *)((long)local_3f8 + lVar5 + 0x20) = 0;
    std::condition_variable::condition_variable(acStack_3d0 + lVar5);
    *(undefined2 *)((long)local_3a0 + lVar5) = 1;
    lVar5 = lVar5 + 0x60;
  } while (lVar5 != 0x3c0);
  lVar5 = 0;
  do {
    local_5b0 = 0;
    local_5b8 = doWork;
    local_5a0 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
    local_5a8 = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
    nonstd::thread_pool::addJob(local_520,&local_5b8,(long)local_3f8 + lVar5);
    if (local_5a8 != (code *)0x0) {
      (*local_5a8)(&local_5b8,&local_5b8,3);
    }
    lVar5 = lVar5 + 0x60;
  } while (lVar5 != 0x3c0);
  local_5bc = 10;
  local_448 = 0;
  uStack_440 = 0;
  local_458 = 0;
  uStack_450 = 0;
  local_438 = 0;
  std::condition_variable::condition_variable(local_430);
  local_400 = 1;
  local_578 = (undefined8 *)0x0;
  uStack_570 = 0;
  local_568 = (code *)0x0;
  pcStack_560 = (code *)0x0;
  local_578 = (undefined8 *)operator_new(0x10);
  *local_578 = setNum;
  local_578[1] = &local_5bc;
  pcStack_560 = std::
                _Function_handler<void_(),_std::_Bind<void_(*(std::reference_wrapper<int>))(int_&)>_>
                ::_M_invoke;
  local_568 = std::
              _Function_handler<void_(),_std::_Bind<void_(*(std::reference_wrapper<int>))(int_&)>_>
              ::_M_manager;
  nonstd::thread_pool::addJob(local_520,&local_578,&local_458);
  if (local_568 != (code *)0x0) {
    (*local_568)(&local_578,&local_578,3);
  }
  nonstd::result::get();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x--. ",5);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_5bc);
  std::endl<char,std::char_traits<char>>(poVar2);
  local_538 = 0;
  local_540 = doWork;
  local_528 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_530 = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  nonstd::thread_pool::addJob(local_520);
  if (local_530 != (code *)0x0) {
    (*local_530)(&local_540,&local_540,3);
  }
  local_588 = (code *)0x0;
  pcStack_580 = (code *)0x0;
  local_598 = (undefined8 *)0x0;
  uStack_590 = 0;
  local_598 = (undefined8 *)operator_new(0x10);
  *local_598 = setNum;
  local_598[1] = &local_5bc;
  pcStack_580 = std::
                _Function_handler<void_(),_std::_Bind<void_(*(std::reference_wrapper<int>))(int_&)>_>
                ::_M_invoke;
  local_588 = std::
              _Function_handler<void_(),_std::_Bind<void_(*(std::reference_wrapper<int>))(int_&)>_>
              ::_M_manager;
  nonstd::thread_pool::addJob(local_520);
  if (local_588 != (code *)0x0) {
    (*local_588)(&local_598,&local_598,3);
  }
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"main loop",9);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    local_550.tv_sec = 5;
    local_550.tv_nsec = 0;
    do {
      iVar1 = nanosleep(&local_550,&local_550);
      if (iVar1 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x---> ",6);
    plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_5bc);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
  } while( true );
}

Assistant:

int main()
{
   nonstd::thread_pool pool(14);
   pool.start();

   nonstd::result res[10];

   for (int i = 0; i < 10; ++i)
     pool.addJob(doWork, res[i]);

   int x = 10;
   nonstd::result res2;
   //waiting for one of thread.
   pool.addJob(std::bind(setNum, std::ref(x)), res2);
   res2.get();
   std::cout << "x--. " << x << std::endl;
   pool.addJob(doWork);
   pool.addJob(std::bind(setNum, std::ref(x)));

   while (1)
     {
        std::cout << "main loop" << std::endl;
        std::this_thread::sleep_for(std::chrono::seconds(5));
        std::cout << "x---> " << x << std::endl;
     }

   pool.stop();

   return 0;
}